

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

int OpenMD::SquareMatrix<double,_3>::jacobi
              (SquareMatrix<double,_3> *a,Vector<double,_3U> *w,SquareMatrix<double,_3> *v)

{
  undefined8 *puVar1;
  double *pdVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  long lVar7;
  undefined1 uVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  double *pdVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double zspace [10];
  double bspace [10];
  double local_d8 [10];
  double adStack_88 [11];
  
  lVar7 = 0;
  pdVar12 = (double *)v;
  do {
    puVar1 = (undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + 0x10) = 0;
    *pdVar12 = 1.0;
    pdVar12 = pdVar12 + 4;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar7 = 0;
  do {
    uVar3 = *(undefined8 *)((long)(a->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 * 4);
    *(undefined8 *)((long)w->data_ + lVar7) = uVar3;
    *(undefined8 *)((long)adStack_88 + lVar7) = uVar3;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x18);
  uVar17 = 0;
  do {
    lVar13 = 0;
    lVar14 = 0;
    dVar21 = 0.0;
    uVar5 = true;
    lVar7 = lVar13;
    do {
      do {
        uVar8 = uVar5;
        dVar21 = dVar21 + ABS((a->super_RectMatrix<double,_3U,_3U>).data_[lVar14][lVar13 + 1]);
        lVar13 = lVar13 + 1;
        uVar5 = uVar8;
      } while (lVar13 != 2);
      lVar13 = lVar7 + 1;
      lVar14 = 1;
      uVar5 = false;
      lVar7 = lVar13;
    } while ((bool)uVar8);
    if ((dVar21 == 0.0) && (!NAN(dVar21))) {
      uVar10 = 1;
      uVar18 = 0;
      bVar4 = true;
      do {
        bVar20 = bVar4;
        uVar11 = uVar10;
        uVar16 = uVar18;
        dVar21 = w->data_[uVar18];
        do {
          dVar24 = w->data_[uVar11];
          if (dVar21 <= dVar24) {
            uVar16 = uVar11 & 0xffffffff;
          }
          dVar21 = (double)(-(ulong)(dVar24 < dVar21) & (ulong)dVar21 |
                           ~-(ulong)(dVar24 < dVar21) & (ulong)dVar24);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
        if (uVar18 != uVar16) {
          w->data_[uVar16] = w->data_[uVar18];
          w->data_[uVar18] = dVar21;
          lVar7 = 0;
          do {
            uVar3 = *(undefined8 *)
                     ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + uVar18 * 8);
            *(undefined8 *)
             ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + uVar18 * 8) =
                 *(undefined8 *)
                  ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + uVar16 * 8);
            *(undefined8 *)
             ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + uVar16 * 8) = uVar3;
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0x48);
        }
        uVar10 = uVar10 + 1;
        uVar18 = 1;
        bVar4 = false;
      } while (bVar20);
      lVar7 = 0;
      do {
        lVar13 = -0x48;
        uVar17 = 0;
        do {
          uVar17 = (uVar17 + 1) - (uint)(*(double *)((long)v + lVar13 + 0x48) < 0.0);
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0);
        if (uVar17 < 2) {
          lVar13 = 0;
          do {
            *(ulong *)((long)v + lVar13) = *(ulong *)((long)v + lVar13) ^ 0x8000000000000000;
            lVar13 = lVar13 + 0x18;
          } while (lVar13 != 0x48);
        }
        lVar7 = lVar7 + 1;
        v = (SquareMatrix<double,_3> *)((long)v + 8);
      } while (lVar7 != 3);
      return 1;
    }
    dVar21 = (dVar21 * 0.2) / 9.0;
    if (2 < uVar17) {
      dVar21 = 0.0;
    }
    uVar10 = 1;
    bVar20 = false;
    pdVar12 = local_d8;
    lVar7 = 0;
    bVar4 = true;
    pdVar9 = (v->super_RectMatrix<double,_3U,_3U>).data_[0];
    do {
      bVar6 = bVar4;
      pdVar9 = pdVar9 + 1;
      pdVar15 = (a->super_RectMatrix<double,_3U,_3U>).data_[lVar7] + 1;
      uVar18 = uVar10;
      pdVar19 = pdVar9;
      do {
        pdVar2 = (a->super_RectMatrix<double,_3U,_3U>).data_[lVar7] + uVar18;
        dVar24 = *pdVar2;
        dVar22 = ABS(dVar24) * 100.0;
        if (uVar17 < 4) {
LAB_001d00f6:
          if (dVar21 < ABS(dVar24)) {
            dVar25 = w->data_[lVar7];
            dVar23 = w->data_[uVar18] - dVar25;
            dVar26 = ABS(dVar23);
            if ((dVar22 + dVar26 != dVar26) || (NAN(dVar22 + dVar26) || NAN(dVar26))) {
              dVar22 = (dVar23 * 0.5) / dVar24;
              dVar23 = 1.0 / (SQRT(dVar22 * dVar22 + 1.0) + ABS(dVar22));
              if (dVar22 < 0.0) {
                dVar23 = -dVar23;
              }
            }
            else {
              dVar23 = dVar24 / dVar23;
            }
            dVar26 = 1.0 / SQRT(dVar23 * dVar23 + 1.0);
            dVar22 = dVar23 * dVar26;
            dVar24 = dVar24 * dVar23;
            *pdVar12 = *pdVar12 - dVar24;
            local_d8[uVar18] = local_d8[uVar18] + dVar24;
            w->data_[lVar7] = dVar25 - dVar24;
            dVar25 = dVar22 / (dVar26 + 1.0);
            w->data_[uVar18] = dVar24 + w->data_[uVar18];
            *pdVar2 = 0.0;
            if (bVar20) {
              dVar24 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][lVar7];
              dVar23 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar18];
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][lVar7] =
                   dVar24 - (dVar24 * dVar25 + dVar23) * dVar22;
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar18] =
                   (dVar24 - dVar23 * dVar25) * dVar22 + dVar23;
            }
            if (lVar7 + 1U < uVar18) {
              dVar24 = (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar18];
              do {
                dVar23 = *pdVar15;
                *pdVar15 = (dVar23 * dVar25 + dVar24) * -dVar22 + dVar23;
                dVar24 = dVar24 + (dVar23 - dVar24 * dVar25) * dVar22;
                (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar18] = dVar24;
              } while (2 < uVar18);
            }
            if (uVar18 != 2) {
              dVar24 = (a->super_RectMatrix<double,_3U,_3U>).data_[lVar7][2];
              dVar23 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar18][2];
              (a->super_RectMatrix<double,_3U,_3U>).data_[lVar7][2] =
                   dVar24 - (dVar24 * dVar25 + dVar23) * dVar22;
              (a->super_RectMatrix<double,_3U,_3U>).data_[uVar18][2] =
                   (dVar24 - dVar23 * dVar25) * dVar22 + dVar23;
            }
            lVar13 = 0;
            do {
              dVar24 = *(double *)
                        ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar13 + lVar7 * 8);
              dVar23 = *(double *)((long)pdVar19 + lVar13);
              *(double *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar13 + lVar7 * 8)
                   = (dVar24 * dVar25 + dVar23) * -dVar22 + dVar24;
              *(double *)((long)pdVar19 + lVar13) = (dVar24 - dVar23 * dVar25) * dVar22 + dVar23;
              lVar13 = lVar13 + 0x18;
            } while (lVar13 != 0x48);
          }
        }
        else {
          dVar25 = ABS(w->data_[lVar7]);
          if ((dVar22 + dVar25 != dVar25) || (NAN(dVar22 + dVar25) || NAN(dVar25)))
          goto LAB_001d00f6;
          dVar25 = ABS(w->data_[uVar18]);
          if ((dVar22 + dVar25 != dVar25) || (NAN(dVar22 + dVar25) || NAN(dVar25)))
          goto LAB_001d00f6;
          *pdVar2 = 0.0;
        }
        uVar18 = uVar18 + 1;
        pdVar19 = pdVar19 + 1;
      } while (uVar18 != 3);
      uVar10 = uVar10 + 1;
      lVar7 = 1;
      bVar20 = true;
      pdVar12 = local_d8 + 1;
      bVar4 = false;
    } while (bVar6);
    lVar7 = 0;
    do {
      dVar21 = adStack_88[lVar7];
      adStack_88[lVar7] = local_d8[lVar7] + dVar21;
      w->data_[lVar7] = local_d8[lVar7] + dVar21;
      local_d8[lVar7] = 0.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    uVar17 = uVar17 + 1;
    if (uVar17 == 0x14) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"SquareMatrix::Jacobi: Error extracting eigenfunctions",0x35)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      return 0;
    }
  } while( true );
}

Assistant:

int SquareMatrix<Real, Dim>::jacobi(SquareMatrix<Real, Dim>& a,
                                      Vector<Real, Dim>& w,
                                      SquareMatrix<Real, Dim>& v) {
    const int n = Dim;
    int i, j, k, iq, ip, numPos;
    Real tresh, theta, tau, t, sm, s, h, g, c, tmp;
    Real bspace[MAX_SCRATCH_ARRAY_SIZE], zspace[MAX_SCRATCH_ARRAY_SIZE];
    Real* b = (n <= MAX_SCRATCH_ARRAY_SIZE) ? bspace : new Real[n];
    Real* z = (n <= MAX_SCRATCH_ARRAY_SIZE) ? zspace : new Real[n];

    // initialize
    for (ip = 0; ip < n; ip++) {
      for (iq = 0; iq < n; iq++) {
        v(ip, iq) = 0.0;
      }
      v(ip, ip) = 1.0;
    }
    for (ip = 0; ip < n; ip++) {
      b[ip] = w[ip] = a(ip, ip);
      z[ip]         = 0.0;
    }

    // begin rotation sequence
    for (i = 0; i < MAX_ROTATIONS; ++i) {
      sm = 0.0;
      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          sm += std::abs(a(ip, iq));
        }
      }
      if (sm == 0.0) { break; }

      if (i < 3) {  // first 3 sweeps
        tresh = 0.2 * sm / (n * n);
      } else {
        tresh = 0.0;
      }

      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          g = 100.0 * std::abs(a(ip, iq));

          // after 4 sweeps
          if (i > 3 && (std::abs(w[ip]) + g) == std::abs(w[ip]) &&
              (std::abs(w[iq]) + g) == std::abs(w[iq])) {
            a(ip, iq) = 0.0;
          } else if (std::abs(a(ip, iq)) > tresh) {
            h = w[iq] - w[ip];
            if ((std::abs(h) + g) == std::abs(h)) {
              t = (a(ip, iq)) / h;
            } else {
              theta = 0.5 * h / (a(ip, iq));
              t     = 1.0 / (std::abs(theta) + std::sqrt(1.0 + theta * theta));
              if (theta < 0.0) { t = -t; }
            }
            c   = 1.0 / std::sqrt(1 + t * t);
            s   = t * c;
            tau = s / (1.0 + c);
            h   = t * a(ip, iq);
            z[ip] -= h;
            z[iq] += h;
            w[ip] -= h;
            w[iq] += h;
            a(ip, iq) = 0.0;

            // ip already shifted left by 1 unit
            for (j = 0; j <= ip - 1; ++j) {
              ROTATE(a, j, ip, j, iq);
            }
            // ip and iq already shifted left by 1 unit
            for (j = ip + 1; j <= iq - 1; ++j) {
              ROTATE(a, ip, j, j, iq);
            }
            // iq already shifted left by 1 unit
            for (j = iq + 1; j < n; ++j) {
              ROTATE(a, ip, j, iq, j);
            }
            for (j = 0; j < n; ++j) {
              ROTATE(v, j, ip, j, iq);
            }
          }
        }
      }

      for (ip = 0; ip < n; ip++) {
        b[ip] += z[ip];
        w[ip] = b[ip];
        z[ip] = 0.0;
      }
    }

    //// this is NEVER called
    if (i >= MAX_ROTATIONS) {
      std::cout << "SquareMatrix::Jacobi: Error extracting eigenfunctions"
                << std::endl;
      if (n > MAX_SCRATCH_ARRAY_SIZE) {
        delete[] b;
        delete[] z;
      }
      return 0;
    }

    // sort eigenfunctions             these changes do not affect accuracy
    for (j = 0; j < n - 1; ++j) {  // boundary incorrect
      k   = j;
      tmp = w[k];
      for (i = j + 1; i < n; ++i) {  // boundary incorrect, shifted already
        if (w[i] >= tmp) {           // why exchage if same?
          k   = i;
          tmp = w[k];
        }
      }
      if (k != j) {
        w[k] = w[j];
        w[j] = tmp;
        for (i = 0; i < n; i++) {
          tmp     = v(i, j);
          v(i, j) = v(i, k);
          v(i, k) = tmp;
        }
      }
    }
    // insure eigenvector consistency (i.e., Jacobi can compute
    // vectors that are negative of one another (.707,.707,0) and
    // (-.707,-.707,0). This can wreak havoc in other stuff. We will
    // select the most positive eigenvector.
    int ceil_half_n = (n >> 1) + (n & 1);
    for (j = 0; j < n; ++j) {
      for (numPos = 0, i = 0; i < n; ++i) {
        if (v(i, j) >= 0.0) { numPos++; }
      }
      if (numPos < ceil_half_n) {
        for (i = 0; i < n; ++i) {
          v(i, j) *= -1.0;
        }
      }
    }

    if (n > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] b;
      delete[] z;
    }
    return 1;
  }